

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisualizerBuffer.cpp
# Opt level: O1

ssize_t __thiscall VisualizerBuffer::write(VisualizerBuffer *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  ulong uVar2;
  unsigned_long __n2;
  long lVar3;
  undefined4 in_register_00000034;
  _Head_base<0UL,_float_*,_false> __dest;
  ulong uVar4;
  void *pvVar5;
  
  pvVar5 = (void *)this->mIgnoreCounter;
  pvVar1 = __buf;
  if (pvVar5 < __buf) {
    pvVar1 = pvVar5;
  }
  this->mIgnoreCounter = (long)pvVar5 - (long)pvVar1;
  if (pvVar5 < __buf) {
    uVar2 = (long)__buf - (long)pvVar1;
    pvVar5 = (void *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar1 * 8);
    __dest._M_head_impl =
         (this->mBufferData)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl + this->mIndex * 2;
    do {
      uVar4 = this->mBufferSize - this->mIndex;
      if (uVar2 < uVar4) {
        uVar4 = uVar2;
      }
      lVar3 = uVar4 * 2;
      if (lVar3 != 0) {
        memmove(__dest._M_head_impl,pvVar5,uVar4 * 8);
      }
      pvVar1 = (void *)(this->mIndex + uVar4);
      this->mIndex = (size_t)pvVar1;
      if (pvVar1 == (void *)this->mBufferSize) {
        this->mIndex = 0;
        __dest._M_head_impl =
             (this->mBufferData)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
      }
      else {
        __dest._M_head_impl = __dest._M_head_impl + uVar4 * 2;
      }
      uVar2 = uVar2 - uVar4;
      if (uVar2 == 0) {
        lVar3 = 0;
      }
      pvVar5 = (void *)((long)pvVar5 + lVar3 * 4);
    } while (uVar2 != 0);
  }
  return (ssize_t)pvVar1;
}

Assistant:

void VisualizerBuffer::write(float buf[], size_t amount) {

    auto ignoring = std::min(mIgnoreCounter, amount);
    amount -= ignoring;
    mIgnoreCounter -= ignoring;

    if (amount) {
        // adjust buffer pointer skip whatever we ignored
        buf += ignoring * 2;

        auto dest = mBufferData.get() + (mIndex * 2);

        // this loop should only iterate two times max, if not then the amount is
        // greater than the buffer's capacity and the caller did not call
        // beginWrite first. Iterating more than twice is inefficient, since we
        // are overwriting what we just copied.
        for (;;) {
            auto const toWrite = std::min(mBufferSize - mIndex, amount);
            auto const toWriteSamples = toWrite * 2;
            std::copy_n(buf, toWriteSamples, dest);
            amount -= toWrite;
            mIndex += toWrite;

            if (mIndex == mBufferSize) {
                mIndex = 0;
                dest = mBufferData.get();
            } else {
                dest += toWriteSamples;
            }

            if (amount > 0) {
                buf += toWriteSamples;
            } else {
                break;
            }
        }

    }

}